

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O1

void __thiscall Fifteen::slotGenerateBoard(Fifteen *this)

{
  bool bVar1;
  BoardSize boardSize;
  Result RVar2;
  QString *pQVar3;
  QByteArrayView QVar4;
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  QArrayData *local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  boardSize = Panel::checkBoardSize
                        ((this->panel)._M_t.
                         super___uniq_ptr_impl<Panel,_std::default_delete<Panel>_>._M_t.
                         super__Tuple_impl<0UL,_Panel_*,_std::default_delete<Panel>_>.
                         super__Head_base<0UL,_Panel_*,_false>._M_head_impl);
  bVar1 = Panel::checkBoardMode
                    ((this->panel)._M_t.super___uniq_ptr_impl<Panel,_std::default_delete<Panel>_>.
                     _M_t.super__Tuple_impl<0UL,_Panel_*,_std::default_delete<Panel>_>.
                     super__Head_base<0UL,_Panel_*,_false>._M_head_impl,GRAPHIC);
  RVar2 = Controller::generateBoard
                    ((this->controller)._M_t.
                     super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
                     super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
                     super__Head_base<0UL,_Controller_*,_false>._M_head_impl,boardSize,(uint)bVar1);
  if (RVar2 != OK) {
    QVar4.m_data = (storage_type *)0x0;
    QVar4.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar4);
    local_48 = local_30;
    uStack_40 = uStack_28;
    local_38 = local_20;
    pQVar3 = Message::getMessage(OK);
    QMessageBox::information(this,&local_48,pQVar3,0x400,0);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,8);
      }
    }
    return;
  }
  createTiles(this);
  setTiles(this);
  return;
}

Assistant:

void Fifteen::slotGenerateBoard()
{
    BoardSize boardSize = panel->checkBoardSize();
    BoardMode boardMode = panel->checkBoardMode( BoardMode::GRAPHIC ) ? BoardMode::GRAPHIC : BoardMode::NUMERIC;

    if ( Result result = controller->generateBoard( boardSize, boardMode ); result != Result::OK )
    {
        QMessageBox::information( this, "", Message::getMessage( result ));
        return;
    }
    redrawTiles();
}